

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O0

long hw_cpu_min_freq(void)

{
  int iVar1;
  char *CPU_FREQ_SCALING_MIN_FREQ;
  char sys_devices_system_cpu [32];
  stat struct_stat;
  char *p;
  long val;
  char *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  stat local_a0;
  char *local_10;
  long local_8;
  
  local_8 = -1;
  iVar1 = stat("/sys/devices/system/cpu/cpu0/cpufreq/scaling_min_freq",&local_a0);
  if ((iVar1 == 0) &&
     (iVar1 = slurpfile(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0), iVar1 != 0)) {
    local_10 = &stack0xffffffffffffff38;
    local_8 = strtol(local_10,(char **)0x0,10);
    local_8 = local_8 / 1000;
  }
  return local_8;
}

Assistant:

long hw_cpu_min_freq( void )
{
  long val = -1;
#ifdef HAVE_MAC_SYSCTL
  size_t vlen;
  vlen = sizeof(long);
  sysctlbyname("hw.cpufrequency_min",&val,&vlen,NULL,0);
  val = val/1e6;

#else
  char *p;

  struct stat struct_stat;
  char sys_devices_system_cpu[32];
  const char *CPU_FREQ_SCALING_MIN_FREQ = "/sys/devices/system/cpu/cpu0/cpufreq/scaling_min_freq";
  if ( stat(CPU_FREQ_SCALING_MIN_FREQ, &struct_stat) == 0 ) {
    if(slurpfile(CPU_FREQ_SCALING_MIN_FREQ, sys_devices_system_cpu, 32)) {
      p = sys_devices_system_cpu;
      val = (strtol( p, (char **)NULL , 10 ) / 1000 );
    }
  }
#endif //end HAVE_MAC_SYSCTL
  return val;
}